

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O0

Token * __thiscall wabt::WastLexer::GetNanToken(Token *__return_storage_ptr__,WastLexer *this)

{
  bool bVar1;
  string_view local_30;
  string_view local_20;
  WastLexer *local_10;
  WastLexer *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20,"nan");
  bVar1 = MatchString(this,local_20);
  if (bVar1) {
    bVar1 = MatchChar(this,':');
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30,"0x");
      bVar1 = MatchString(this,local_30);
      if (((bVar1) && (bVar1 = ReadHexNum(this), bVar1)) &&
         (bVar1 = NoTrailingReservedChars(this), bVar1)) {
        LiteralToken(__return_storage_ptr__,this,First_Literal,Nan);
        return __return_storage_ptr__;
      }
    }
    else {
      bVar1 = NoTrailingReservedChars(this);
      if (bVar1) {
        LiteralToken(__return_storage_ptr__,this,First_Literal,Nan);
        return __return_storage_ptr__;
      }
    }
  }
  GetKeywordToken(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetNanToken() {
  if (MatchString("nan")) {
    if (MatchChar(':')) {
      if (MatchString("0x") && ReadHexNum() && NoTrailingReservedChars()) {
        return LiteralToken(TokenType::Float, LiteralType::Nan);
      }
    } else if (NoTrailingReservedChars()) {
      return LiteralToken(TokenType::Float, LiteralType::Nan);
    }
  }
  return GetKeywordToken();
}